

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoNode.cc
# Opt level: O3

void __thiscall VideoNode::~VideoNode(VideoNode *this)

{
  Resources *__ptr;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__VideoNode_001f8720;
  std::unique_ptr<VideoEngine,_std::default_delete<VideoEngine>_>::~unique_ptr(&this->engine);
  __ptr = (this->resources)._M_t.super___uniq_ptr_impl<Resources,_std::default_delete<Resources>_>.
          _M_t.super__Tuple_impl<0UL,_Resources_*,_std::default_delete<Resources>_>.
          super__Head_base<0UL,_Resources_*,_false>._M_head_impl;
  if (__ptr != (Resources *)0x0) {
    std::default_delete<Resources>::operator()((default_delete<Resources> *)&this->resources,__ptr);
  }
  (this->resources)._M_t.super___uniq_ptr_impl<Resources,_std::default_delete<Resources>_>._M_t.
  super__Tuple_impl<0UL,_Resources_*,_std::default_delete<Resources>_>.
  super__Head_base<0UL,_Resources_*,_false>._M_head_impl = (Resources *)0x0;
  std::unique_ptr<PolledPipelineDesc,_std::default_delete<PolledPipelineDesc>_>::~unique_ptr
            (&this->polled_pipeline);
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__INode_001f83f0;
  pcVar1 = (this->super_INode).name_._M_dataplus._M_p;
  paVar2 = &(this->super_INode).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void VideoNode::paint(float dt, const Timecode& tc, IScope &scope) {
	static unsigned int frame_seq = 0;
	frame_seq++;

	if (polled_pipeline->poll(frame_seq)) {
		engine.reset(new VideoEngine(*resources, polled_pipeline->get()));
		engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (engine)
		engine->paint(frame_seq, preview.w, preview.h, tc.row, dt, scope);
}